

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DuplicateFunctionElimination.cpp
# Opt level: O1

void __thiscall
wasm::DuplicateFunctionElimination::run(DuplicateFunctionElimination *this,Module *module)

{
  size_t *__dest;
  PassRunner *pPVar1;
  pointer puVar2;
  Function *pFVar3;
  iterator __position;
  Function *right;
  char *pcVar4;
  undefined **ppuVar5;
  _Base_ptr p_Var6;
  bool bVar7;
  mapped_type *pmVar8;
  vector<wasm::Function*,std::allocator<wasm::Function*>> *this_00;
  const_iterator cVar9;
  mapped_type *pmVar10;
  _Base_ptr p_Var11;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *import;
  _Base_ptr *pp_Var12;
  pointer puVar13;
  size_t sVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  undefined1 local_260 [8];
  Map hashes;
  map<unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
  hashGroups;
  code *local_120;
  undefined8 uStack_118;
  code *local_110;
  code *pcStack_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  undefined **local_e8;
  Module *local_e0;
  undefined1 local_d8 [8];
  map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  replacements;
  undefined1 local_80 [8];
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> duplicates;
  long local_48;
  
  pPVar1 = (this->super_Pass).runner;
  iVar15 = (pPVar1->options).optimizeLevel;
  if ((iVar15 < 3) && ((pPVar1->options).shrinkLevel < 1)) {
    uVar16 = (ulong)((uint)(iVar15 == 2) * 9 + 1);
  }
  else {
    uVar16 = (ulong)((long)(module->functions).
                           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(module->functions).
                          super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3;
  }
  local_e8 = &PTR__FunctionHasher_00d883a0;
  local_e0 = module;
  while( true ) {
    pp_Var12 = &hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((int)uVar16 == 0) {
      return;
    }
    FunctionHasher::createMap((Map *)local_260,module);
    ppuVar5 = local_e8;
    hashGroups._M_t._M_impl._0_8_ = 0;
    hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)
         ((ulong)hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left &
         0xffffffffffffff00);
    hashGroups._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    hashes.
    super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_e8;
    uStack_118 = 0;
    local_120 = ExpressionAnalyzer::nothingHasher;
    pcStack_108 = std::
                  _Function_handler<bool_(wasm::Expression_*,_unsigned_long_&),_bool_(*)(wasm::Expression_*,_unsigned_long_&)>
                  ::_M_invoke;
    local_110 = std::
                _Function_handler<bool_(wasm::Expression_*,_unsigned_long_&),_bool_(*)(wasm::Expression_*,_unsigned_long_&)>
                ::_M_manager;
    hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = pp_Var12;
    WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>
    ::run((WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>
           *)&hashes.
              super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
              ._M_t._M_impl.super__Rb_tree_header._M_node_count,(this->super_Pass).runner,module);
    hashes.
    super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)ppuVar5;
    if (local_110 != (code *)0x0) {
      (*local_110)(&local_120,&local_120,3);
    }
    hashes.
    super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
    ._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)&PTR__Pass_00d87048;
    if ((_Base_ptr *)hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ != pp_Var12) {
      operator_delete((void *)hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,
                      (ulong)((long)&(hashGroups._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_left)->_M_color + 1));
    }
    hashGroups._M_t._M_impl._0_8_ = hashGroups._M_t._M_impl._0_8_ & 0xffffffff00000000;
    hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&hashGroups;
    hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    puVar2 = (module->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    for (puVar13 = (module->functions).
                   super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar13 != puVar2;
        puVar13 = puVar13 + 1) {
      pFVar3 = (puVar13->_M_t).
               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(pFVar3->super_Importable).module + 8) == (char *)0x0) {
        local_d8 = (undefined1  [8])pFVar3;
        pmVar8 = std::
                 map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
                 ::operator[]((map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
                               *)local_260,(key_type *)local_d8);
        local_80._0_4_ = (undefined4)*pmVar8;
        this_00 = (vector<wasm::Function*,std::allocator<wasm::Function*>> *)
                  std::
                  map<unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                  ::operator[]((map<unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                                *)&hashes.
                                   super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
                                   ._M_t._M_impl.super__Rb_tree_header._M_node_count,
                               (key_type *)local_80);
        __position._M_current = *(Function ***)(this_00 + 8);
        if (__position._M_current == *(Function ***)(this_00 + 0x10)) {
          std::vector<wasm::Function*,std::allocator<wasm::Function*>>::
          _M_realloc_insert<wasm::Function*const&>(this_00,__position,(Function **)local_d8);
        }
        else {
          *__position._M_current = (Function *)local_d8;
          *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
        }
      }
    }
    replacements._M_t._M_impl._0_4_ = 0;
    replacements._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    replacements._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    replacements._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&replacements;
    replacements._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    duplicates._M_t._M_impl._0_4_ = 0;
    duplicates._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    duplicates._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    duplicates._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&duplicates;
    duplicates._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_f0 = (ulong)((int)uVar16 - 1);
    replacements._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         replacements._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    duplicates._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         duplicates._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    for (p_Var11 = hashGroups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var6 = replacements._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
        module = local_e0, p_Var11 != (_Rb_tree_node_base *)&hashGroups;
        p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
      uVar16 = (ulong)((long)p_Var11[1]._M_left - (long)p_Var11[1]._M_parent) >> 3;
      iVar15 = (int)uVar16;
      if ((iVar15 != 1) && (iVar15 - 1U != 0)) {
        local_f8 = uVar16 & 0xffffffff;
        local_100 = (ulong)(iVar15 - 1U);
        local_48 = 1;
        sVar14 = 0;
        do {
          pFVar3 = *(Function **)(&(p_Var11[1]._M_parent)->_M_color + sVar14 * 2);
          cVar9 = std::
                  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                  ::find((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                          *)local_80,(key_type *)pFVar3);
          duplicates._M_t._M_impl.super__Rb_tree_header._M_node_count = sVar14 + 1;
          if ((cVar9._M_node == (_Base_ptr)&duplicates) &&
             (lVar17 = local_48,
             duplicates._M_t._M_impl.super__Rb_tree_header._M_node_count < local_f8)) {
            do {
              right = *(Function **)(&(p_Var11[1]._M_parent)->_M_color + lVar17 * 2);
              cVar9 = std::
                      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                      ::find((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                              *)local_80,(key_type *)right);
              if ((cVar9._M_node == (_Base_ptr)&duplicates) &&
                 (bVar7 = FunctionUtils::equal(pFVar3,right), bVar7)) {
                pmVar10 = std::
                          map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                          ::operator[]((map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                                        *)local_d8,(key_type *)right);
                pcVar4 = (pFVar3->super_Importable).super_Named.name.super_IString.str._M_str;
                (pmVar10->super_IString).str._M_len =
                     (pFVar3->super_Importable).super_Named.name.super_IString.str._M_len;
                (pmVar10->super_IString).str._M_str = pcVar4;
                std::
                _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                ::_M_insert_unique<wasm::Name_const&>
                          ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                            *)local_80,(Name *)right);
              }
              lVar17 = lVar17 + 1;
            } while (iVar15 != (int)lVar17);
          }
          local_48 = local_48 + 1;
          sVar14 = duplicates._M_t._M_impl.super__Rb_tree_header._M_node_count;
        } while (duplicates._M_t._M_impl.super__Rb_tree_header._M_node_count != local_100);
      }
    }
    if (replacements._M_t._M_impl.super__Rb_tree_header._M_header._M_right == (_Base_ptr)0x0) break;
    replacements._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_80;
    Module::removeFunctions
              (local_e0,(function<bool_(wasm::Function_*)> *)
                        &replacements._M_t._M_impl.super__Rb_tree_header._M_node_count);
    uVar16 = local_f0;
    __dest = &replacements._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::
    _Function_handler<bool_(wasm::Function_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/DuplicateFunctionElimination.cpp:98:11)>
    ::_M_manager((_Any_data *)__dest,(_Any_data *)__dest,__destroy_functor);
    OptUtils::replaceFunctions
              ((this->super_Pass).runner,module,
               (map<wasm::Name,_wasm::Name,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                *)local_d8);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)local_80);
    std::
    _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                 *)local_d8);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
                 *)&hashes.
                    super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
                    ._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::Function_*const,_unsigned_long>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
    ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::Function_*const,_unsigned_long>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
                 *)local_260);
    if (p_Var6 == (_Base_ptr)0x0) {
      return;
    }
  }
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)local_80);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Name>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
               *)local_d8);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<wasm::Function_*,_std::allocator<wasm::Function_*>_>_>_>_>
               *)&hashes.
                  super_map<wasm::Function_*,_unsigned_long,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
                  ._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::Function_*const,_unsigned_long>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::Function_*const,_unsigned_long>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_unsigned_long>_>_>
               *)local_260);
  return;
}

Assistant:

void run(Module* module) override {
    // Multiple iterations may be necessary: A and B may be identical only after
    // we see the functions C1 and C2 that they call are in fact identical.
    // Rarely, such "chains" can be very long, so we limit how many we do.
    auto& options = getPassOptions();
    Index limit;
    if (options.optimizeLevel >= 3 || options.shrinkLevel >= 1) {
      limit = module->functions.size(); // no limit
    } else if (options.optimizeLevel >= 2) {
      // 10 passes usually does most of the work, as this is typically
      // logarithmic
      limit = 10;
    } else {
      limit = 1;
    }
    while (limit > 0) {
      limit--;
      // Hash all the functions
      auto hashes = FunctionHasher::createMap(module);
      FunctionHasher(&hashes).run(getPassRunner(), module);
      // Find hash-equal groups
      std::map<uint32_t, std::vector<Function*>> hashGroups;
      ModuleUtils::iterDefinedFunctions(*module, [&](Function* func) {
        hashGroups[hashes[func]].push_back(func);
      });
      // Find actually equal functions and prepare to replace them
      std::map<Name, Name> replacements;
      std::set<Name> duplicates;
      for (auto& [_, group] : hashGroups) {
        Index size = group.size();
        if (size == 1) {
          continue;
        }
        // The groups should be fairly small, and even if a group is large we
        // should have almost all of them identical, so we should not hit actual
        // O(N^2) here unless the hash is quite poor.
        for (Index i = 0; i < size - 1; i++) {
          auto* first = group[i];
          if (duplicates.count(first->name)) {
            continue;
          }
          for (Index j = i + 1; j < size; j++) {
            auto* second = group[j];
            if (duplicates.count(second->name)) {
              continue;
            }
            if (FunctionUtils::equal(first, second)) {
              // great, we can replace the second with the first!
              replacements[second->name] = first->name;
              duplicates.insert(second->name);
            }
          }
        }
      }
      // perform replacements
      if (replacements.size() > 0) {
        // remove the duplicates
        module->removeFunctions(
          [&](Function* func) { return duplicates.count(func->name) > 0; });
        OptUtils::replaceFunctions(getPassRunner(), *module, replacements);
      } else {
        break;
      }
    }
  }